

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

void __thiscall
Clasp::ClaspConfig::addConfigurator(ClaspConfig *this,Configurator *c,Type t,bool once)

{
  Configurator *pCVar1;
  ConfiguratorProxy local_10;
  
  local_10.set = 0;
  local_10.cfg = (uint64)c;
  if (t == Acquire || once) {
    pCVar1 = (Configurator *)((ulong)c | 0x4000000000000000);
    if (!once) {
      pCVar1 = c;
    }
    local_10.cfg = (uint64)((ulong)pCVar1 | 0x2000000000000000);
    if (t != Acquire) {
      local_10.cfg = (uint64)pCVar1;
    }
  }
  bk_lib::
  pod_vector<Clasp::ClaspConfig::Impl::ConfiguratorProxy,_std::allocator<Clasp::ClaspConfig::Impl::ConfiguratorProxy>_>
  ::push_back(&this->impl_->pp,&local_10);
  return;
}

Assistant:

void ClaspConfig::addConfigurator(Configurator* c, Ownership_t::Type t, bool once) {
	impl_->add(c, t, once);
}